

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_CustomBulletAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined1 auVar2 [12];
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  AActor *pAVar9;
  PClass *pPVar10;
  PClassActor *pufftype;
  AActor *proj;
  AActor *puff;
  uint uVar11;
  int iVar12;
  AActor *origin;
  char *pcVar13;
  bool bVar14;
  void *pvVar15;
  AActor *pAVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  DThinker *pDVar21;
  undefined1 auVar22 [16];
  undefined8 uVar24;
  undefined1 auVar23 [16];
  DVector2 v;
  uint local_154;
  void *local_148;
  PClassActor *local_128;
  FName local_110;
  FName local_10c;
  void *local_108;
  double local_100;
  AActor *local_f8;
  void *local_f0;
  void *local_e8;
  double dStack_e0;
  undefined1 local_d8 [32];
  DAngle local_b8;
  DAngle local_b0;
  DAngle local_a8;
  DAngle local_a0;
  DAngle local_98;
  FSoundID local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  DAngle local_60;
  undefined1 local_58 [24];
  DAngle local_40;
  DAngle local_38;
  PClass *pPVar8;
  
  pPVar10 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_003cc67b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003cc64c:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003cc67b:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64d,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003cbedc;
    pPVar8 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar3 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar3);
      (origin->super_DThinker).super_DObject.Class = pPVar8;
    }
    bVar14 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar10 && bVar14) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar14 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar10) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (!bVar14) {
      pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003cc67b;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003cc64c;
LAB_003cbedc:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar13 = "(paramnum) < numparam";
LAB_003cc6a3:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64e,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar13 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003cc6a3;
  }
  if (numparam < 3) {
    pcVar13 = "(paramnum) < numparam";
LAB_003cc6cb:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64f,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar13 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003cc6cb;
  }
  if (numparam == 3) {
    pcVar13 = "(paramnum) < numparam";
LAB_003cc6f3:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x650,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar13 = "param[paramnum].Type == REGT_INT";
    goto LAB_003cc6f3;
  }
  if ((uint)numparam < 5) {
    pcVar13 = "(paramnum) < numparam";
LAB_003cc71b:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x651,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar13 = "param[paramnum].Type == REGT_INT";
    goto LAB_003cc71b;
  }
  local_e8 = param[1].field_0.field_1.a;
  dStack_e0 = 0.0;
  dVar20 = param[2].field_0.f;
  iVar3 = param[3].field_0.i;
  iVar1 = param[4].field_0.i;
  if (numparam == 5) {
    param = defaultparam->Array;
    if (param[5].field_0.field_3.Type != '\x03') {
LAB_003cc7bb:
      pcVar13 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003cc7c2:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x652,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pufftype = (PClassActor *)param[5].field_0.field_1.a;
    if (param[5].field_0.field_1.atag != 1) {
      if (pufftype != (PClassActor *)0x0) goto LAB_003cc7bb;
      pufftype = (PClassActor *)0x0;
    }
LAB_003cbfe6:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cc7ea:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x653,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_148 = param[6].field_0.field_1.a;
LAB_003cbff9:
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cc7a3:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x654,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_154 = param[7].field_0.i;
LAB_003cc00e:
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cc784:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x655,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar12 = param[8].field_0.i;
LAB_003cc025:
    if (param[9].field_0.field_3.Type != '\x03') {
LAB_003cc655:
      pcVar13 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003cc65c:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x656,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_128 = (PClassActor *)param[9].field_0.field_1.a;
    if (param[9].field_0.field_1.atag != 1) {
      if (local_128 != (PClassActor *)0x0) goto LAB_003cc655;
      local_128 = (PClassActor *)0x0;
    }
LAB_003cc052:
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cc765:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x657,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_108 = param[10].field_0.field_1.a;
  }
  else {
    if ((param[5].field_0.field_3.Type != '\x03') ||
       (pufftype = (PClassActor *)param[5].field_0.field_1.a,
       pufftype != (PClassActor *)0x0 && param[5].field_0.field_1.atag != 1)) {
      pcVar13 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003cc7c2;
    }
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003cbfe6;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003cc7ea;
    }
    local_148 = (void *)param[6].field_0.f;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003cbff9;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cc7a3;
    }
    local_154 = param[7].field_0.i;
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003cc00e;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cc784;
    }
    iVar12 = param[8].field_0.i;
    if (numparam == 9) {
      param = defaultparam->Array;
      goto LAB_003cc025;
    }
    if ((param[9].field_0.field_3.Type != '\x03') ||
       (local_128 = (PClassActor *)param[9].field_0.field_1.a,
       local_128 != (PClassActor *)0x0 && param[9].field_0.field_1.atag != 1)) {
      pcVar13 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003cc65c;
    }
    if ((uint)numparam < 0xb) {
      param = defaultparam->Array;
      goto LAB_003cc052;
    }
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003cc765;
    }
    local_108 = param[10].field_0.field_1.a;
    if (numparam != 0xb) {
      if (param[0xb].field_0.field_3.Type != '\x01') {
        pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_003cc746;
      }
      goto LAB_003cc08b;
    }
    param = defaultparam->Array;
  }
  if (param[0xb].field_0.field_3.Type != '\x01') {
    pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cc746:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x658,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003cc08b:
  local_f0 = param[0xb].field_0.field_1.a;
  pAVar9 = COPY_AAPTR(origin,iVar12);
  if ((pAVar9 != (AActor *)0x0) || ((local_154 & 1) != 0)) {
    if ((local_154 & 1) == 0) {
      local_38.Degrees = 0.0;
      local_40.Degrees = 270.0;
      local_58._16_8_ = 0.0;
      local_58._8_8_ = 0.0;
      A_Face(origin,pAVar9,&local_38,&local_40,(DAngle *)(local_58 + 0x10),(DAngle *)(local_58 + 8),
             0,0.0);
    }
    local_f8 = (AActor *)(origin->Angles).Yaw.Degrees;
    local_100 = 0.0;
    if ((local_154 & 8) == 0) {
      local_60.Degrees = 0.0;
      local_58._0_8_ = local_f8;
      P_AimLineAttack((AActor *)local_d8,(DAngle *)origin,2048.0,(FTranslatedLineTarget *)local_58,
                      (DAngle *)0x0,(int)&local_60,(AActor *)0x0,(AActor *)0x0);
      local_100 = (double)CONCAT44(local_d8._4_4_,local_d8._0_4_);
    }
    if (pufftype == (PClassActor *)0x0) {
      local_d8._0_4_ = 0x40;
      pPVar10 = PClass::FindClass((FName *)local_d8);
      pufftype = dyn_cast<PClassActor>((DObject *)pPVar10);
    }
    local_8c.ID = (origin->AttackSound).super_FSoundID.ID;
    S_Sound(origin,1,&local_8c,1.0,1.0);
    if (0 < iVar3) {
      local_88._8_8_ = 0;
      local_88._0_8_ =
           ~-(ulong)((double)local_148 == 0.0) & (ulong)local_148 |
           -(ulong)((double)local_148 == 0.0) & 0x40a0000000000000;
      uVar11 = local_154 >> 3 & 2;
      local_d8._24_8_ = ZEXT48(uVar11);
      dStack_e0 = dVar20;
      do {
        pvVar15 = local_e8;
        dVar20 = dStack_e0;
        if ((local_154 & 4) == 0) {
          uVar4 = FRandom::GenRand32(&pr_cwbullet);
          uVar5 = FRandom::GenRand32(&pr_cwbullet);
          uVar6 = FRandom::GenRand32(&pr_cwbullet);
          uVar7 = FRandom::GenRand32(&pr_cwbullet);
          auVar18._4_4_ = uVar6;
          auVar18._0_4_ = uVar4;
          auVar18._8_8_ = 0;
          auVar18 = auVar18 & ZEXT816(0xff000000ff);
          auVar22._4_4_ = uVar7;
          auVar22._0_4_ = uVar5;
          auVar22._8_8_ = 0;
          auVar22 = auVar22 & ZEXT816(0xff000000ff);
          auVar19._0_8_ = (double)(auVar18._0_4_ - auVar22._0_4_);
          auVar19._8_8_ = (double)(auVar18._4_4_ - auVar22._4_4_);
          auVar18 = divpd(auVar19,_DAT_005e1950);
          pvVar15 = (void *)(auVar18._0_8_ * (double)local_e8);
          dVar20 = auVar18._8_8_ * dStack_e0;
        }
        iVar12 = iVar1;
        if ((local_154 & 2) == 0) {
          uVar4 = FRandom::GenRand32(&pr_cabullet);
          iVar12 = (uint)(byte)((char)uVar4 + (char)((uVar4 & 0xff) / 3) * -3 + 1) * iVar1;
        }
        pDVar21 = (DThinker *)((double)local_f8 + (double)pvVar15);
        uVar24 = 0;
        pAVar16 = (AActor *)(dVar20 + local_100);
        local_10c.Index = 0xcd;
        local_a0.Degrees = (double)pAVar16;
        local_98.Degrees = (double)pDVar21;
        pAVar9 = P_LineAttack(origin,&local_98,(double)local_88._0_8_,&local_a0,iVar12,&local_10c,
                              pufftype,(int)local_d8._24_8_,(FTranslatedLineTarget *)0x0,(int *)0x0)
        ;
        if (pufftype != (PClassActor *)0x0 && local_128 != (PClassActor *)0x0) {
          dVar20 = FFastTrig::cos(&fasttrig,
                                  (double)pDVar21 * 11930464.711111112 + 6755399441055744.0);
          dVar20 = dVar20 * (double)local_f0;
          dVar17 = FFastTrig::sin(&fasttrig,dVar20);
          local_d8._16_8_ = (origin->__Pos).Z;
          local_78._0_8_ = (origin->__Pos).X;
          local_78._8_8_ = (origin->__Pos).Y;
          auVar2._4_8_ = uVar24;
          auVar2._0_4_ = (int)((ulong)local_78._0_8_ >> 0x20);
          auVar23._0_8_ = auVar2._0_8_ << 0x20;
          auVar23._8_4_ = (int)local_78._8_8_;
          auVar23._12_4_ = (int)((ulong)local_78._8_8_ >> 0x20);
          P_GetOffsetPosition((double)local_78._0_8_,auVar23._8_8_,dVar20,dVar17 * (double)local_f0)
          ;
          dVar17 = (origin->__Pos).Z + 0.0;
          (origin->__Pos).Z = dVar17;
          (origin->__Pos).X = (double)CONCAT44(local_d8._4_4_,local_d8._0_4_);
          (origin->__Pos).Y = (double)local_d8._8_8_;
          dVar20 = AActor::GetBobOffset(origin,0.0);
          local_a8.Degrees = (origin->Angles).Yaw.Degrees;
          proj = P_SpawnMissileAngleZSpeed
                           (origin,dVar20 + dVar17 + (double)local_108,local_128,&local_a8,0.0,
                            *(double *)((local_128->super_PClass).Defaults + 0xe0),origin,false);
          (origin->__Pos).Z = (double)local_d8._16_8_;
          (origin->__Pos).X = (double)local_78._0_8_;
          (origin->__Pos).Y = (double)local_78._8_8_;
          if (proj != (AActor *)0x0) {
            puff = pAVar9;
            if (pAVar9 == (AActor *)0x0) {
              local_110.Index = 0xcd;
              local_b8.Degrees = (double)pAVar16;
              local_b0.Degrees = (double)pDVar21;
              puff = P_LineAttack(origin,&local_b0,(double)local_88._0_8_,&local_b8,0,&local_110,
                                  pufftype,uVar11 + 8,(FTranslatedLineTarget *)0x0,(int *)0x0);
              if (puff == (AActor *)0x0) goto LAB_003cc556;
            }
            AimBulletMissile(proj,puff,local_154,pAVar9 == (AActor *)0x0,true);
          }
        }
LAB_003cc556:
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomBulletAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE		(spread_xy);
	PARAM_ANGLE		(spread_z);
	PARAM_INT		(numbullets);
	PARAM_INT		(damageperbullet);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_FLOAT_DEF	(range);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(ptr);
	PARAM_CLASS_DEF (missile, AActor);
	PARAM_FLOAT_DEF (Spawnheight);
	PARAM_FLOAT_DEF (Spawnofs_xy);

	AActor *ref = COPY_AAPTR(self, ptr);

	if (range == 0)
		range = MISSILERANGE;

	int i;
	DAngle bangle;
	DAngle bslope = 0.;
	int laflags = (flags & CBAF_NORANDOMPUFFZ)? LAF_NORANDOMPUFFZ : 0;

	if (ref != NULL || (flags & CBAF_AIMFACING))
	{
		if (!(flags & CBAF_AIMFACING))
		{
			A_Face(self, ref);
		}
		bangle = self->Angles.Yaw;

		if (!(flags & CBAF_NOPITCH)) bslope = P_AimLineAttack (self, bangle, MISSILERANGE);
		if (pufftype == nullptr) pufftype = PClass::FindActor(NAME_BulletPuff);

		S_Sound (self, CHAN_WEAPON, self->AttackSound, 1, ATTN_NORM);
		for (i = 0; i < numbullets; i++)
		{
			DAngle angle = bangle;
			DAngle slope = bslope;

			if (flags & CBAF_EXPLICITANGLE)
			{
				angle += spread_xy;
				slope += spread_z;
			}
			else
			{
				angle += spread_xy * (pr_cwbullet.Random2() / 255.);
				slope += spread_z * (pr_cwbullet.Random2() / 255.);
			}

			int damage = damageperbullet;

			if (!(flags & CBAF_NORANDOM))
				damage *= ((pr_cabullet()%3)+1);

			AActor *puff = P_LineAttack(self, angle, range, slope, damage, NAME_Hitscan, pufftype, laflags);
			if (missile != nullptr && pufftype != nullptr)
			{
				double x = Spawnofs_xy * angle.Cos();
				double y = Spawnofs_xy * angle.Sin();
				
				DVector3 pos = self->Pos();
				self->SetXYZ(self->Vec3Offset(x, y, 0.));
				AActor *proj = P_SpawnMissileAngleZSpeed(self, self->Z() + self->GetBobOffset() + Spawnheight, missile, self->Angles.Yaw, 0, GetDefaultByType(missile)->Speed, self, false);
				self->SetXYZ(pos);
				
				if (proj)
				{
					bool temp = (puff == nullptr);
					if (!puff)
					{
						puff = P_LineAttack(self, angle, range, slope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
					}
					if (puff)
					{			
						AimBulletMissile(proj, puff, flags, temp, true);
					}
				}
			}
		}
    }
	return 0;
}